

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.h
# Opt level: O2

void __thiscall CGI::CGI(CGI *this,CharContent *path,CharContent *name,int connfd)

{
  this->_vptr_CGI = (_func_int **)&PTR__CGI_00117d38;
  CharContent::CharContent(&this->_path,path);
  CharContent::CharContent(&this->_name,name);
  this->_connfd = connfd;
  return;
}

Assistant:

CGI(const CharContent &path,const CharContent &name,int connfd):_path(path),_name(name),_connfd(connfd){}